

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

xmlRelaxNGDefinePtr_conflict xmlRelaxNGNewDefine(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr node)

{
  int iVar1;
  xmlRelaxNGDefinePtr_conflict *ppxVar2;
  xmlRelaxNGDefinePtr_conflict *tmp;
  xmlRelaxNGDefinePtr_conflict ret;
  xmlNodePtr node_local;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  if (ctxt->defMax == 0) {
    ctxt->defMax = 0x10;
    ctxt->defNr = 0;
    ppxVar2 = (xmlRelaxNGDefinePtr_conflict *)(*xmlMalloc)((long)ctxt->defMax << 3);
    ctxt->defTab = ppxVar2;
    if (ctxt->defTab == (xmlRelaxNGDefinePtr_conflict *)0x0) {
      xmlRngPErrMemory(ctxt);
      return (xmlRelaxNGDefinePtr_conflict)0x0;
    }
  }
  else if (ctxt->defMax <= ctxt->defNr) {
    ctxt->defMax = ctxt->defMax << 1;
    ppxVar2 = (xmlRelaxNGDefinePtr_conflict *)(*xmlRealloc)(ctxt->defTab,(long)ctxt->defMax << 3);
    if (ppxVar2 == (xmlRelaxNGDefinePtr_conflict *)0x0) {
      xmlRngPErrMemory(ctxt);
      return (xmlRelaxNGDefinePtr_conflict)0x0;
    }
    ctxt->defTab = ppxVar2;
  }
  ctxt_local = (xmlRelaxNGParserCtxtPtr)(*xmlMalloc)(0x70);
  if (ctxt_local == (xmlRelaxNGParserCtxtPtr)0x0) {
    xmlRngPErrMemory(ctxt);
    ctxt_local = (xmlRelaxNGParserCtxtPtr)0x0;
  }
  else {
    memset(ctxt_local,0,0x70);
    iVar1 = ctxt->defNr;
    ctxt->defNr = iVar1 + 1;
    ctxt->defTab[iVar1] = (xmlRelaxNGDefinePtr_conflict)ctxt_local;
    ctxt_local->error = (xmlRelaxNGValidityErrorFunc)node;
    *(short *)&ctxt_local->nbInterleaves = -1;
  }
  return (xmlRelaxNGDefinePtr_conflict)ctxt_local;
}

Assistant:

static xmlRelaxNGDefinePtr
xmlRelaxNGNewDefine(xmlRelaxNGParserCtxtPtr ctxt, xmlNodePtr node)
{
    xmlRelaxNGDefinePtr ret;

    if (ctxt->defMax == 0) {
        ctxt->defMax = 16;
        ctxt->defNr = 0;
        ctxt->defTab = (xmlRelaxNGDefinePtr *)
            xmlMalloc(ctxt->defMax * sizeof(xmlRelaxNGDefinePtr));
        if (ctxt->defTab == NULL) {
            xmlRngPErrMemory(ctxt);
            return (NULL);
        }
    } else if (ctxt->defMax <= ctxt->defNr) {
        xmlRelaxNGDefinePtr *tmp;

        ctxt->defMax *= 2;
        tmp = (xmlRelaxNGDefinePtr *) xmlRealloc(ctxt->defTab,
                                                 ctxt->defMax *
                                                 sizeof
                                                 (xmlRelaxNGDefinePtr));
        if (tmp == NULL) {
            xmlRngPErrMemory(ctxt);
            return (NULL);
        }
        ctxt->defTab = tmp;
    }
    ret = (xmlRelaxNGDefinePtr) xmlMalloc(sizeof(xmlRelaxNGDefine));
    if (ret == NULL) {
        xmlRngPErrMemory(ctxt);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlRelaxNGDefine));
    ctxt->defTab[ctxt->defNr++] = ret;
    ret->node = node;
    ret->depth = -1;
    return (ret);
}